

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)

{
  int iVar1;
  SyBlob sBlob;
  SyMemBackend *local_38;
  void *local_30;
  int local_28;
  int local_24;
  uint local_20;
  
  if (pBuf != (void *)0x0) {
    local_24 = *pnByte;
    if (local_24 < 0) {
      iVar1 = -0x18;
    }
    else {
      local_28 = 0;
      local_38 = (SyMemBackend *)0x0;
      local_20 = 3;
      local_30 = pBuf;
      iVar1 = (*pCursor->pStore->pIo->pMethods->xKey)(pCursor,unqliteDataConsumer,&local_38);
      *pnByte = local_28;
      if (((local_20 & 6) == 0) && (local_24 != 0)) {
        SyMemBackendFree(local_38,local_30);
      }
    }
    return iVar1;
  }
  iVar1 = (*pCursor->pStore->pIo->pMethods->xKeyLength)(pCursor,pnByte);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Key length only */
		rc = pCursor->pStore->pIo->pMethods->xKeyLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the key */
		rc = pCursor->pStore->pIo->pMethods->xKey(pCursor,unqliteDataConsumer,&sBlob);
		 /* Key length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}